

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::check_inferred_latch(Generator *top)

{
  undefined1 local_60 [8];
  LatchVisitor visitor;
  
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_60 = (undefined1  [8])&PTR_visit_root_002b6208;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_60,top);
  local_60 = (undefined1  [8])&PTR_visit_root_002b0dc0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void check_inferred_latch(Generator* top) {
    LatchVisitor visitor;
    visitor.visit_generator_root_p(top);
}